

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

int miniros::network::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  const_iterator this;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *msg;
  invalid_argument *anon_var_0;
  out_of_range *anon_var_0_1;
  unsigned_long rawValue;
  bool failed;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  EVP_PKEY_CTX *in_stack_fffffffffffffe90;
  allocator<char> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string local_148 [39];
  undefined1 local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  byte local_c1;
  _Self local_c0;
  allocator<char> local_b1;
  string local_b0 [32];
  _Base_ptr local_90;
  _Self local_88;
  allocator<char> local_79;
  string local_78 [32];
  _Base_ptr local_58;
  _Self local_50 [3];
  allocator<char> local_31;
  string local_30 [32];
  _Self local_10;
  EVP_PKEY_CTX *local_8;
  
  local_8 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
             (allocator<char> *)in_stack_fffffffffffffe90);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_fffffffffffffe58,(key_type *)0x47651b);
  local_10._M_node = this._M_node;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe58);
  bVar1 = std::operator!=(&local_10,local_50);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x476586);
    std::__cxx11::string::operator=((string *)g_host_abi_cxx11_,(string *)&ppVar3->second);
  }
  else {
    in_stack_fffffffffffffe98 = &local_79;
    in_stack_fffffffffffffe90 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_node,
               (char *)in_stack_fffffffffffffe98,(allocator<char> *)in_stack_fffffffffffffe90);
    local_58 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(in_stack_fffffffffffffe58,(key_type *)0x476633);
    local_10._M_node = local_58;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffe58);
    bVar1 = std::operator!=(&local_10,&local_88);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x4766ae);
      std::__cxx11::string::operator=((string *)g_host_abi_cxx11_,(string *)&ppVar3->second);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_node,
             (char *)in_stack_fffffffffffffe98,(allocator<char> *)in_stack_fffffffffffffe90);
  local_90 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_fffffffffffffe58,(key_type *)0x47675a);
  local_10._M_node = local_90;
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe58);
  bVar1 = std::operator!=(&local_10,&local_c0);
  if (bVar1) {
    local_c1 = 1;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x4767e0);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::stoul(in_stack_fffffffffffffe60,(size_t *)in_stack_fffffffffffffe58,0);
    if (__lhs < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffff) {
      g_tcpros_server_port = SUB82(__lhs,0);
      local_c1 = 0;
    }
    local_d0 = __lhs;
    if ((local_c1 & 1) != 0) {
      local_121 = 1;
      msg = (string *)__cxa_allocate_exception(0x10);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x4768fd);
      std::operator+((char *)ctx,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     this._M_node);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
      InvalidPortException::InvalidPortException
                ((InvalidPortException *)in_stack_fffffffffffffe60,msg);
      local_121 = 0;
      __cxa_throw(msg,&InvalidPortException::typeinfo,InvalidPortException::~InvalidPortException);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    determineHost_abi_cxx11_();
    std::__cxx11::string::operator=((string *)g_host_abi_cxx11_,local_148);
    uVar2 = std::__cxx11::string::~string(local_148);
  }
  return uVar2;
}

Assistant:

void init(const M_string& remappings)
{
  M_string::const_iterator it = remappings.find("__hostname");
  if (it != remappings.end()) {
    g_host = it->second;
  } else {
    it = remappings.find("__ip");
    if (it != remappings.end()) {
      g_host = it->second;
    }
  }

  it = remappings.find("__tcpros_server_port");
  if (it != remappings.end()) {
    bool failed = true;
    try {
      auto rawValue = std::stoul(it->second);
      if (rawValue < 65535) {
        g_tcpros_server_port = rawValue;
        failed = false;
      }
    } catch (std::invalid_argument&) {
    } catch (std::out_of_range&) {
    }

    if (failed) {
      throw miniros::InvalidPortException(
        "__tcpros_server_port [" + it->second + "] was not specified as a number within the 0-65535 range");
    }
  }

  if (g_host.empty()) {
    g_host = determineHost();
  }
}